

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelets.cpp
# Opt level: O0

void Wavegeneral_v(Mat *a,int JJ,int n,int isign,double *P,double *Q,int fsize)

{
  float fVar1;
  double dVar2;
  double dVar3;
  ulong uVar4;
  int iVar5;
  float *pfVar6;
  int local_54;
  int local_50;
  int i_2;
  int j_1;
  int k_1;
  int r;
  int i_1;
  int k;
  int j;
  int i;
  int nh;
  double *Q_local;
  double *P_local;
  int isign_local;
  int n_local;
  int JJ_local;
  Mat *a_local;
  
  if (fsize <= n) {
    iVar5 = n >> 1;
    if (isign < 0) {
      j_1 = iVar5 - (fsize / 2 + -1);
      for (k_1 = 0; k_1 < n; k_1 = k_1 + 2) {
        Wavegeneral_v::b[k_1] = 0.0;
        Wavegeneral_v::b[k_1 + 1] = 0.0;
        local_50 = 0;
        for (i_2 = fsize + -2; -1 < i_2; i_2 = i_2 + -2) {
          dVar2 = P[i_2];
          uVar4 = (long)(j_1 + local_50) % (long)*(int *)(a + 8);
          pfVar6 = cv::Mat::at<float>(a,(int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 |
                                                    uVar4 & 0xffffffff) % (long)iVar5),JJ);
          fVar1 = *pfVar6;
          dVar3 = Q[i_2];
          uVar4 = (long)(j_1 + local_50) % (long)*(int *)(a + 8);
          pfVar6 = cv::Mat::at<float>(a,iVar5 + (int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) <<
                                                             0x20 | uVar4 & 0xffffffff) %
                                                     (long)iVar5),JJ);
          Wavegeneral_v::b[k_1] =
               (float)((double)Wavegeneral_v::b[k_1] +
                      dVar2 * (double)fVar1 + dVar3 * (double)*pfVar6);
          dVar2 = P[i_2 + 1];
          uVar4 = (long)(j_1 + local_50) % (long)*(int *)(a + 8);
          pfVar6 = cv::Mat::at<float>(a,(int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 |
                                                    uVar4 & 0xffffffff) % (long)iVar5),JJ);
          fVar1 = *pfVar6;
          dVar3 = Q[i_2 + 1];
          uVar4 = (long)(j_1 + local_50) % (long)*(int *)(a + 8);
          pfVar6 = cv::Mat::at<float>(a,iVar5 + (int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) <<
                                                             0x20 | uVar4 & 0xffffffff) %
                                                     (long)iVar5),JJ);
          Wavegeneral_v::b[k_1 + 1] =
               (float)((double)Wavegeneral_v::b[k_1 + 1] +
                      dVar2 * (double)fVar1 + dVar3 * (double)*pfVar6);
          local_50 = local_50 + 1;
        }
        j_1 = j_1 + 1;
      }
    }
    else {
      k = 0;
      for (i_1 = 0; i_1 < n; i_1 = i_1 + 2) {
        Wavegeneral_v::b[k] = 0.0;
        Wavegeneral_v::b[k + iVar5] = 0.0;
        for (r = 0; r < fsize; r = r + 1) {
          dVar2 = P[r];
          pfVar6 = cv::Mat::at<float>(a,(i_1 + r) % n,JJ);
          Wavegeneral_v::b[k] = (float)(dVar2 * (double)*pfVar6 + (double)Wavegeneral_v::b[k]);
          dVar2 = Q[r];
          pfVar6 = cv::Mat::at<float>(a,(i_1 + r) % n,JJ);
          Wavegeneral_v::b[k + iVar5] =
               (float)(dVar2 * (double)*pfVar6 + (double)Wavegeneral_v::b[k + iVar5]);
        }
        k = k + 1;
      }
    }
    for (local_54 = 0; local_54 < n; local_54 = local_54 + 1) {
      fVar1 = Wavegeneral_v::b[local_54];
      pfVar6 = cv::Mat::at<float>(a,local_54,JJ);
      *pfVar6 = fVar1;
    }
  }
  return;
}

Assistant:

static void 
Wavegeneral_v(cv::Mat& a, int JJ, int n, int isign, double *P, double *Q, int fsize)
{
  static float b[1024];
	
  if (n < fsize) return;
  int nh = n >> 1;
	
  if (isign >= 0) 
  {
    for (int i = 0, j = 0; j < n; j+=2, ++i) 
    {
      b[i]=0.0f;
      b[i+nh]=0.0f;
			
      for(int k = 0; k < fsize; ++k) 
      {
        b[i] += P[k] * a.at<float>( (j+k)%n, JJ);
        b[i+nh] += Q[k] * a.at<float>( (j+k)%n, JJ);
      }
    }
  } 
  else 
  {
    for (int i = 0,r = nh-(fsize/2-1); i < n; r+=1, i+=2) 
    {
      b[i]=0.0f;
      b[i+1]=0.0f;
			
      for(int k = fsize-2, j = 0; k >= 0; k-=2, j+=1) 
      {
        b[i] += P[k] * a.at<float>(((r+j)%a.rows)%nh, JJ) + Q[k] * a.at<float>(nh+((r+j)%a.rows)%nh, JJ);
        b[i+1] += P[k+1] * a.at<float>(((r+j)%a.rows)%nh, JJ) + Q[k+1] * a.at<float>(nh+((r+j)%a.rows)%nh, JJ);
      }
    }
  }
  for(int i = 0; i < n; ++i)
    a.at<float>(i, JJ) = b[i];
}